

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderControlStatementTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::LoopCase::LoopCase
          (LoopCase *this,Context *context,char *name,char *description,LoopType type,
          DecisionType decisionType,bool isLoopBoundStable,bool isVertex)

{
  ControlStatementCase::ControlStatementCase
            (&this->super_ControlStatementCase,context->m_testCtx,context->m_renderCtx,name,
             description,(uint)!isVertex);
  (this->super_ControlStatementCase).super_ShaderPerformanceCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__LoopCase_01e3dae0;
  this->m_decisionType = decisionType;
  this->m_type = type;
  this->m_isLoopBoundStable = isLoopBoundStable;
  (this->m_boundArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_boundArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_boundArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_boundArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  return;
}

Assistant:

LoopCase::LoopCase (Context& context, const char* name, const char* description, LoopType type, DecisionType decisionType, bool isLoopBoundStable, bool isVertex)
	: ControlStatementCase	(context.getTestContext(), context.getRenderContext(), name, description, isVertex ? CASETYPE_VERTEX : CASETYPE_FRAGMENT)
	, m_decisionType		(decisionType)
	, m_type				(type)
	, m_isLoopBoundStable	(isLoopBoundStable)
	, m_arrayBuffer			(0)
{
}